

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImGuiID IVar9;
  uint uVar10;
  ImGuiNavLayer IVar11;
  ImGuiWindow *pIVar12;
  ImGuiWindow *pIVar13;
  ImRect cand;
  ImRect cand_00;
  ImVec2 IVar14;
  ImGuiContext *pIVar15;
  bool bVar16;
  bool bVar17;
  undefined4 in_register_00000034;
  ImGuiNavMoveResult *pIVar18;
  ImGuiContext *g;
  ImGui *this;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar15 = GImGui;
  pIVar18 = (ImGuiNavMoveResult *)CONCAT44(in_register_00000034,id);
  pIVar12 = GImGui->CurrentWindow;
  if (id != 0) {
    piVar1 = &(pIVar12->DC).NavLayerActiveMaskNext;
    *piVar1 = *piVar1 | (pIVar12->DC).NavLayerCurrentMask;
    IVar9 = pIVar15->NavId;
    if ((((IVar9 == id) || (pIVar15->NavAnyRequest == true)) &&
        (pIVar13 = pIVar15->NavWindow, pIVar13->RootWindowForNav == pIVar12->RootWindowForNav)) &&
       ((pIVar12 == pIVar13 || (((uint)(pIVar13->Flags | pIVar12->Flags) >> 0x17 & 1) != 0)))) {
      if (nav_bb_arg == (ImRect *)0x0) {
        nav_bb_arg = bb;
      }
      uVar10 = (pIVar12->DC).ItemFlags;
      uVar7 = ((ImGuiNavMoveResult *)nav_bb_arg)->ID;
      uVar8 = ((ImGuiNavMoveResult *)nav_bb_arg)->SelectScopeId;
      fVar19 = (pIVar12->Pos).x;
      fVar23 = (float)uVar7 - fVar19;
      fVar20 = (pIVar12->Pos).y;
      fVar24 = (float)uVar8 - fVar20;
      fVar19 = SUB84(((ImGuiNavMoveResult *)nav_bb_arg)->Window,0) - fVar19;
      fVar20 = (float)((ulong)((ImGuiNavMoveResult *)nav_bb_arg)->Window >> 0x20) - fVar20;
      if (pIVar15->NavInitRequest == true) {
        IVar11 = pIVar15->NavLayer;
        pIVar18 = (ImGuiNavMoveResult *)(ulong)IVar11;
        if (IVar11 == (pIVar12->DC).NavLayerCurrent) {
          if ((uVar10 & 0x10) == 0) {
            pIVar15->NavInitResultId = id;
            (pIVar15->NavInitResultRectRel).Min.x = fVar23;
            (pIVar15->NavInitResultRectRel).Min.y = fVar24;
            (pIVar15->NavInitResultRectRel).Max.x = fVar19;
            (pIVar15->NavInitResultRectRel).Max.y = fVar20;
            pIVar15->NavInitRequest = false;
            pIVar18 = (ImGuiNavMoveResult *)
                      (ulong)CONCAT31((int3)(IVar11 >> 8),pIVar15->NavMoveRequest);
            pIVar15->NavAnyRequest = pIVar15->NavMoveRequest;
          }
          else if (pIVar15->NavInitResultId == 0) {
            pIVar15->NavInitResultId = id;
            (pIVar15->NavInitResultRectRel).Min.x = fVar23;
            (pIVar15->NavInitResultRectRel).Min.y = fVar24;
            (pIVar15->NavInitResultRectRel).Max.x = fVar19;
            (pIVar15->NavInitResultRectRel).Max.y = fVar20;
          }
        }
      }
      if (((IVar9 != id) || ((pIVar15->NavMoveRequestFlags & 0x10) != 0)) && ((uVar10 & 0xc) == 0))
      {
        this = (ImGui *)&pIVar15->NavMoveResultOther;
        if (pIVar12 == pIVar13) {
          this = (ImGui *)&pIVar15->NavMoveResultLocal;
        }
        if ((pIVar15->NavMoveRequest == true) &&
           (cand.Min.x = (float)((ImGuiNavMoveResult *)nav_bb_arg)->ID,
           cand.Min.y = (float)((ImGuiNavMoveResult *)nav_bb_arg)->SelectScopeId,
           cand.Max = (ImVec2)((ImGuiNavMoveResult *)nav_bb_arg)->Window,
           bVar16 = NavScoreItem(this,pIVar18,cand), bVar16)) {
          *(ImGuiID *)this = id;
          *(ImGuiID *)(this + 4) = pIVar15->MultiSelectScopeId;
          *(ImGuiWindow **)(this + 8) = pIVar12;
          *(float *)(this + 0x1c) = fVar23;
          *(float *)(this + 0x20) = fVar24;
          *(float *)(this + 0x24) = fVar19;
          *(float *)(this + 0x28) = fVar20;
        }
        if (((pIVar15->NavMoveRequestFlags & 0x20) != 0) &&
           (pIVar18 = (ImGuiNavMoveResult *)nav_bb_arg,
           bVar16 = ImRect::Overlaps(&pIVar12->ClipRect,nav_bb_arg), bVar16)) {
          fVar4 = (float)((ImGuiNavMoveResult *)nav_bb_arg)->SelectScopeId;
          fVar5 = *(float *)((long)&((ImGuiNavMoveResult *)nav_bb_arg)->Window + 4);
          fVar6 = (pIVar12->ClipRect).Min.y;
          fVar21 = (pIVar12->ClipRect).Max.y;
          fVar22 = fVar21;
          if (fVar5 <= fVar21) {
            fVar22 = fVar5;
          }
          if (fVar4 <= fVar21) {
            fVar21 = fVar4;
          }
          if (((fVar5 - fVar4) * 0.7 <=
               (float)(-(uint)(fVar5 < fVar6) & (uint)fVar6 | ~-(uint)(fVar5 < fVar6) & (uint)fVar22
                      ) -
               (float)(-(uint)(fVar4 < fVar6) & (uint)fVar6 | ~-(uint)(fVar4 < fVar6) & (uint)fVar21
                      )) &&
             (cand_00.Min.x = (float)((ImGuiNavMoveResult *)nav_bb_arg)->ID,
             cand_00.Min.y = (float)((ImGuiNavMoveResult *)nav_bb_arg)->SelectScopeId,
             cand_00.Max = (ImVec2)((ImGuiNavMoveResult *)nav_bb_arg)->Window,
             bVar16 = NavScoreItem((ImGui *)&pIVar15->NavMoveResultLocalVisibleSet,pIVar18,cand_00),
             bVar16)) {
            (pIVar15->NavMoveResultLocalVisibleSet).ID = id;
            (pIVar15->NavMoveResultLocalVisibleSet).SelectScopeId = pIVar15->MultiSelectScopeId;
            (pIVar15->NavMoveResultLocalVisibleSet).Window = pIVar12;
            (pIVar15->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar23;
            (pIVar15->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar24;
            (pIVar15->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar19;
            (pIVar15->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar20;
          }
        }
      }
      if (pIVar15->NavId == id) {
        pIVar15->NavWindow = pIVar12;
        IVar11 = (pIVar12->DC).NavLayerCurrent;
        pIVar15->NavLayer = IVar11;
        pIVar15->NavIdIsAlive = true;
        pIVar15->NavIdTabCounter = (pIVar12->DC).FocusCounterTab;
        pIVar3 = pIVar12->NavRectRel + IVar11;
        (pIVar3->Min).x = fVar23;
        (pIVar3->Min).y = fVar24;
        (pIVar3->Max).x = fVar19;
        (pIVar3->Max).y = fVar20;
      }
    }
  }
  (pIVar12->DC).LastItemId = id;
  IVar14 = bb->Max;
  (pIVar12->DC).LastItemRect.Min = bb->Min;
  (pIVar12->DC).LastItemRect.Max = IVar14;
  (pIVar12->DC).LastItemStatusFlags = 0;
  (pIVar15->NextItemData).Flags = 0;
  bVar16 = IsClippedEx(bb,id,false);
  if ((!bVar16) && (bVar17 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar17)) {
    pIVar2 = &(pIVar12->DC).LastItemStatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return !bVar16;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakID)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakID = 0;
        }
#endif
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}